

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

int4 __thiscall ParamEntry::justifiedContain(ParamEntry *this,Address *addr,int4 sz)

{
  AddrSpace *pAVar1;
  uintb uVar2;
  uintb uVar3;
  bool bVar4;
  int4 iVar5;
  int iVar6;
  VarnodeData *pVVar7;
  AddrSpace *pAVar8;
  uintb uVar9;
  ulong uVar10;
  int4 res_1;
  uintb endaddr;
  uintb startaddr;
  Address entry;
  int4 cur;
  VarnodeData *vdata;
  int local_28;
  int4 i;
  int4 res;
  int4 sz_local;
  Address *addr_local;
  ParamEntry *this_local;
  
  if (this->joinrec == (JoinRecord *)0x0) {
    if (this->alignment == 0) {
      Address::Address((Address *)&startaddr,this->spaceid,this->addressbase);
      this_local._4_4_ =
           Address::justifiedContain
                     ((Address *)&startaddr,this->size,addr,sz,(this->flags & 1) != 0);
    }
    else {
      pAVar1 = this->spaceid;
      pAVar8 = Address::getSpace(addr);
      if (pAVar1 == pAVar8) {
        uVar9 = Address::getOffset(addr);
        if (uVar9 < this->addressbase) {
          this_local._4_4_ = -1;
        }
        else {
          uVar10 = (uVar9 + (long)sz) - 1;
          if (uVar10 < uVar9) {
            this_local._4_4_ = -1;
          }
          else if ((this->addressbase + (long)this->size) - 1 < uVar10) {
            this_local._4_4_ = -1;
          }
          else {
            uVar2 = this->addressbase;
            uVar3 = this->addressbase;
            bVar4 = isLeftJustified(this);
            if (bVar4) {
              this_local._4_4_ = (int4)((uVar9 - uVar2) % (ulong)(long)this->alignment);
            }
            else {
              iVar6 = (int)(((uVar10 - uVar3) + 1) % (ulong)(long)this->alignment);
              if (iVar6 == 0) {
                this_local._4_4_ = 0;
              }
              else {
                this_local._4_4_ = this->alignment - iVar6;
              }
            }
          }
        }
      }
      else {
        this_local._4_4_ = -1;
      }
    }
  }
  else {
    local_28 = 0;
    vdata._4_4_ = JoinRecord::numPieces(this->joinrec);
    while (vdata._4_4_ = vdata._4_4_ + -1, -1 < vdata._4_4_) {
      pVVar7 = JoinRecord::getPiece(this->joinrec,vdata._4_4_);
      VarnodeData::getAddr((VarnodeData *)&entry.offset);
      iVar5 = Address::justifiedContain((Address *)&entry.offset,pVVar7->size,addr,sz,false);
      if (-1 < iVar5) {
        return local_28 + iVar5;
      }
      local_28 = pVVar7->size + local_28;
    }
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int4 ParamEntry::justifiedContain(const Address &addr,int4 sz) const

{
  if (joinrec != (JoinRecord *)0) {
    int4 res = 0;
    for(int4 i=joinrec->numPieces()-1;i>=0;--i) { // Move from least significant to most
      const VarnodeData &vdata(joinrec->getPiece(i));
      int4 cur = vdata.getAddr().justifiedContain(vdata.size,addr,sz,false);
      if (cur<0)
	res += vdata.size;	// We skipped this many less significant bytes
      else {
	return res + cur;
      }
    }
    return -1;			// Not contained at all
  }
  if (alignment==0) {
    // Ordinary endian containment
    Address entry(spaceid,addressbase);
    return entry.justifiedContain(size,addr,sz,((flags&force_left_justify)!=0));
  }
  if (spaceid != addr.getSpace()) return -1;
  uintb startaddr = addr.getOffset();
  if (startaddr < addressbase) return -1;
  uintb endaddr = startaddr + sz - 1;
  if (endaddr < startaddr) return -1; // Don't allow wrap around
  if (endaddr > (addressbase+size-1)) return -1;
  startaddr -= addressbase;
  endaddr -= addressbase;
  if (!isLeftJustified()) {   // For right justified (big endian), endaddr must be aligned
    int4 res = (int4)((endaddr+1) % alignment);
    if (res==0) return 0;
    return (alignment-res);
  }
  return (int4)(startaddr % alignment);
}